

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

Endpoint * __thiscall
helics::MessageFederateManager::getDataSink(MessageFederateManager *this,string_view name)

{
  int iVar1;
  string *this_00;
  Endpoint **ppEVar2;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> ept;
  handle sharedEpt;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_48;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_30,&this->mLocalEndpoints);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_48,local_30.data,name);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppEVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppEVar2 == (Endpoint **)0x0) {
      ppEVar2 = &gmlc::containers::
                 StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end::
                 emptyValue;
    }
    else {
      ppEVar2 = ppEVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppEVar2 = ppEVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  if (((ppEVar2 != local_48.vec) &&
      ((((local_48.vec == (Endpoint **)0x0 || (ppEVar2 == (Endpoint **)0x0)) ||
        (*local_48.vec != (Endpoint *)0x0)) || (*ppEVar2 != (Endpoint *)0x0)))) ||
     (iVar1 != local_48.offset)) {
    this_00 = Interface::getExtractionType_abi_cxx11_(&(local_48.ptr)->super_Interface);
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this_00,"sink");
    if (iVar1 == 0) goto LAB_001e74a1;
  }
  local_48.ptr = (Endpoint *)invalidEptNC;
LAB_001e74a1:
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30.m_handle_lock);
  return local_48.ptr;
}

Assistant:

Endpoint& MessageFederateManager::getDataSink(std::string_view name)
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    if (ept == sharedEpt.end()) {
        return invalidEptNC;
    }
    if (ept->getType() != "sink") {
        return invalidEptNC;
    }
    return *ept;
}